

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-port.cc
# Opt level: O3

string * __thiscall
testing::internal::FormatFileLocation_abi_cxx11_
          (string *__return_storage_ptr__,internal *this,char *file,int line)

{
  long lVar1;
  size_t sVar2;
  undefined8 *puVar3;
  long *plVar4;
  size_type *psVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__str;
  ulong uVar6;
  undefined8 uVar7;
  string file_name;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str_1;
  int local_ac;
  long *local_a8;
  undefined8 local_a0;
  long local_98;
  undefined8 uStack_90;
  long *local_88;
  long local_80;
  long local_78 [2];
  string local_68;
  ulong *local_48;
  long local_40;
  ulong local_38 [2];
  
  local_ac = (int)file;
  if (this == (internal *)0x0) {
    this = (internal *)"unknown file";
  }
  local_88 = local_78;
  sVar2 = strlen((char *)this);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,this,this + sVar2);
  if (local_ac < 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)__return_storage_ptr__,local_88,local_80 + (long)local_88);
    std::__cxx11::string::append((char *)__return_storage_ptr__);
    goto LAB_00162257;
  }
  local_48 = local_38;
  std::__cxx11::string::_M_construct<char*>((string *)&local_48,local_88,local_80 + (long)local_88);
  std::__cxx11::string::append((char *)&local_48);
  StreamableToString<int>(&local_68,&local_ac);
  uVar6 = 0xf;
  if (local_48 != local_38) {
    uVar6 = local_38[0];
  }
  if (uVar6 < local_68._M_string_length + local_40) {
    uVar7 = 0xf;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      uVar7 = local_68.field_2._M_allocated_capacity;
    }
    if ((ulong)uVar7 < local_68._M_string_length + local_40) goto LAB_0016212a;
    puVar3 = (undefined8 *)
             std::__cxx11::string::replace((ulong)&local_68,0,(char *)0x0,(ulong)local_48);
  }
  else {
LAB_0016212a:
    puVar3 = (undefined8 *)
             std::__cxx11::string::_M_append((char *)&local_48,(ulong)local_68._M_dataplus._M_p);
  }
  local_a8 = &local_98;
  plVar4 = puVar3 + 2;
  if ((long *)*puVar3 == plVar4) {
    local_98 = *plVar4;
    uStack_90 = puVar3[3];
  }
  else {
    local_98 = *plVar4;
    local_a8 = (long *)*puVar3;
  }
  local_a0 = puVar3[1];
  *puVar3 = plVar4;
  puVar3[1] = 0;
  *(undefined1 *)plVar4 = 0;
  plVar4 = (long *)std::__cxx11::string::append((char *)&local_a8);
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  psVar5 = (size_type *)(plVar4 + 2);
  if ((size_type *)*plVar4 == psVar5) {
    lVar1 = plVar4[3];
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
    *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar1;
  }
  else {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar4;
    (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar5;
  }
  __return_storage_ptr__->_M_string_length = plVar4[1];
  *plVar4 = (long)psVar5;
  plVar4[1] = 0;
  *(undefined1 *)(plVar4 + 2) = 0;
  if (local_a8 != &local_98) {
    operator_delete(local_a8,local_98 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68._M_dataplus._M_p != &local_68.field_2) {
    operator_delete(local_68._M_dataplus._M_p,local_68.field_2._M_allocated_capacity + 1);
  }
  if (local_48 != local_38) {
    operator_delete(local_48,local_38[0] + 1);
  }
LAB_00162257:
  if (local_88 != local_78) {
    operator_delete(local_88,local_78[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

GTEST_API_ ::std::string FormatFileLocation(const char* file, int line) {
  const std::string file_name(file == nullptr ? kUnknownFile : file);

  if (line < 0) {
    return file_name + ":";
  }
#ifdef _MSC_VER
  return file_name + "(" + StreamableToString(line) + "):";
#else
  return file_name + ":" + StreamableToString(line) + ":";
#endif  // _MSC_VER
}